

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectMTx(MT *pMT)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((MT *)addrsMT[lVar2] == pMT) {
      iVar1 = DisconnectMT(pMT);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsMT[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectMTx(MT* pMT)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectMT(pMT);
	if (res != EXIT_SUCCESS) return res;

	addrsMT[id] = NULL;

	return EXIT_SUCCESS;
}